

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_threaded.cpp
# Opt level: O3

void __thiscall CGraphics_Threaded::Swap(CGraphics_Threaded *this)

{
  CCommandBuffer *pCVar1;
  int iVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  CSwapCommand Cmd;
  CSwapCommand local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_DoScreenshot == true) {
    iVar2 = (**(code **)(*(long *)this + 0x1a0))(this);
    if (iVar2 != 0) {
      ScreenshotDirect(this,this->m_aScreenshotName);
    }
    this->m_DoScreenshot = false;
  }
  local_28.super_CCommand.m_Cmd = 8;
  local_28.super_CCommand.m_pNext = (CCommand *)0x0;
  local_28.m_Finish = this->m_pConfig->m_GfxFinish;
  CCommandBuffer::AddCommand<CCommandBuffer::CSwapCommand>(this->m_pCommandBuffer,&local_28);
  (*this->m_pBackend->_vptr_IGraphicsBackend[0x11])(this->m_pBackend,this->m_pCommandBuffer);
  uVar3 = (ulong)this->m_CurrentCommandBuffer ^ 1;
  this->m_CurrentCommandBuffer = (uint)uVar3;
  pCVar1 = this->m_apCommandBuffers[uVar3];
  this->m_pCommandBuffer = pCVar1;
  (pCVar1->m_CmdBuffer).m_Used = 0;
  *(undefined8 *)&(pCVar1->m_DataBuffer).m_Used = 0;
  *(undefined8 *)((long)&pCVar1->m_pCmdBufferHead + 4) = 0;
  *(undefined4 *)((long)&pCVar1->m_pCmdBufferTail + 4) = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CGraphics_Threaded::Swap()
{
	// TODO: screenshot support
	if(m_DoScreenshot)
	{
		if(WindowActive())
			ScreenshotDirect(m_aScreenshotName);
		m_DoScreenshot = false;
	}

	// add swap command
	CCommandBuffer::CSwapCommand Cmd;
	Cmd.m_Finish = m_pConfig->m_GfxFinish;
	m_pCommandBuffer->AddCommand(Cmd);

	// kick the command buffer
	KickCommandBuffer();
}